

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O1

TransformDerivative * __thiscall
iDynTree::TransformDerivative::derivativeOfInverse
          (TransformDerivative *__return_storage_ptr__,TransformDerivative *this,Transform *a_H_b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ActualDstType actualDst;
  Position *pPVar7;
  Rotation *pRVar8;
  PointerType ptr;
  PointerType ptr_1;
  PointerType ptr_5;
  PointerType ptr_4;
  double dVar9;
  double dVar10;
  double dVar11;
  Packet2d mask;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> d_b_R_a;
  Transform b_H_a;
  Matrix3x3 *local_130 [2];
  assign_op<double,_double> local_120 [56];
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_e8;
  Transform local_90;
  
  Transform::inverse(&local_90,a_H_b);
  pPVar7 = Transform::getPosition(&local_90);
  pRVar8 = Transform::getRotation(&local_90);
  local_130[0] = &__return_storage_ptr__->rotDerivative;
  local_e8.m_lhs.m_lhs.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pRVar8;
  local_e8.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->rotDerivative).m_data;
  local_e8.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pRVar8;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_130,
             &local_e8,local_120,(type)0x0);
  dVar10 = (this->posDerivative).m_data[0] +
           (this->rotDerivative).m_data[2] * (pPVar7->super_Vector3).m_data[2] +
           (pPVar7->super_Vector3).m_data[1] * (this->rotDerivative).m_data[1] +
           (pPVar7->super_Vector3).m_data[0] * (this->rotDerivative).m_data[0];
  dVar11 = (this->posDerivative).m_data[1] +
           (this->rotDerivative).m_data[5] * (pPVar7->super_Vector3).m_data[2] +
           (pPVar7->super_Vector3).m_data[1] * (this->rotDerivative).m_data[4] +
           (pPVar7->super_Vector3).m_data[0] * (this->rotDerivative).m_data[3];
  dVar9 = (this->rotDerivative).m_data[8] * (pPVar7->super_Vector3).m_data[2] +
          (pPVar7->super_Vector3).m_data[1] * (this->rotDerivative).m_data[7] +
          (pPVar7->super_Vector3).m_data[0] * (this->rotDerivative).m_data[6] +
          (this->posDerivative).m_data[2];
  dVar3 = (pRVar8->super_Matrix3x3).m_data[3];
  dVar4 = (pRVar8->super_Matrix3x3).m_data[4];
  dVar1 = (pRVar8->super_Matrix3x3).m_data[5];
  dVar5 = (pRVar8->super_Matrix3x3).m_data[6];
  dVar6 = (pRVar8->super_Matrix3x3).m_data[7];
  dVar2 = (pRVar8->super_Matrix3x3).m_data[8];
  (__return_storage_ptr__->posDerivative).m_data[0] =
       (-(pRVar8->super_Matrix3x3).m_data[1] * dVar11 +
       -(pRVar8->super_Matrix3x3).m_data[0] * dVar10) - (pRVar8->super_Matrix3x3).m_data[2] * dVar9;
  (__return_storage_ptr__->posDerivative).m_data[1] =
       (-dVar4 * dVar11 + -dVar3 * dVar10) - dVar1 * dVar9;
  (__return_storage_ptr__->posDerivative).m_data[2] =
       (-dVar6 * dVar11 + -dVar5 * dVar10) - dVar9 * dVar2;
  return __return_storage_ptr__;
}

Assistant:

TransformDerivative TransformDerivative::derivativeOfInverse(const Transform& a_H_b) const
{
    Transform b_H_a = a_H_b.inverse();

    TransformDerivative ret;

    // For the sake of compact notation, we will indicated
    // a_R_b the rotational part of a_H_b, and a_O_b the translation part of a_H_b)
    Eigen::Map<const Eigen::Vector3d> d_a_O_b(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > d_a_R_b(this->rotDerivative.data());

    Eigen::Map<const Eigen::Vector3d> b_O_a(b_H_a.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > b_R_a(b_H_a.getRotation().data());

    Eigen::Map<Eigen::Vector3d> d_b_O_a(ret.posDerivative.data());
    Eigen::Map<Eigen::Matrix<double,3,3,Eigen::RowMajor> > d_b_R_a(ret.rotDerivative.data());

    // ~^b \dot{R}_a = - b_R_a a_\dot{R}_b b_R_a
    d_b_R_a = -b_R_a*d_a_R_b*b_R_a;

    // ~^b \dot{O}_a = - b_R_a*(a_\dot{R}_b ~^b O_a + ~^a \dot{O}_b
    d_b_O_a = -b_R_a*(d_a_R_b*b_O_a+d_a_O_b);

    return ret;
}